

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

string * __thiscall
phosg::format_data_abi_cxx11_
          (string *__return_storage_ptr__,phosg *this,iovec *iovs,size_t num_iovs,
          uint64_t start_address,iovec *prev_iovs,size_t num_prev_iovs,uint64_t flags)

{
  string *__str;
  function<void_(const_void_*,_unsigned_long)> local_b8;
  tuple<phosg::StringWriter_*,_std::_Placeholder<1>,_std::_Placeholder<2>_> *local_88;
  code *local_80;
  undefined8 local_78;
  undefined1 local_70 [8];
  type write_data;
  StringWriter w;
  size_t num_prev_iovs_local;
  iovec *prev_iovs_local;
  uint64_t start_address_local;
  size_t num_iovs_local;
  iovec *iovs_local;
  
  StringWriter::StringWriter((StringWriter *)&write_data._M_bound_args);
  local_80 = StringWriter::write;
  local_78 = 0;
  local_88 = &write_data._M_bound_args;
  ::std::
  bind<void(phosg::StringWriter::*)(void_const*,unsigned_long),phosg::StringWriter*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
            ((type *)local_70,(offset_in_StringWriter_to_subr *)&local_80,(StringWriter **)&local_88
             ,(_Placeholder<1> *)&::std::placeholders::_1,
             (_Placeholder<2> *)&::std::placeholders::_2);
  ::std::function<void(void_const*,unsigned_long)>::
  function<std::_Bind<void(phosg::StringWriter::*(phosg::StringWriter*,std::_Placeholder<1>,std::_Placeholder<2>))(void_const*,unsigned_long)>&,void>
            ((function<void(void_const*,unsigned_long)> *)&local_b8,
             (_Bind<void_(phosg::StringWriter::*(phosg::StringWriter_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_void_*,_unsigned_long)>
              *)local_70);
  format_data(&local_b8,(iovec *)this,(size_t)iovs,num_iovs,(iovec *)start_address,(size_t)prev_iovs
              ,num_prev_iovs);
  ::std::function<void_(const_void_*,_unsigned_long)>::~function(&local_b8);
  __str = StringWriter::str_abi_cxx11_((StringWriter *)&write_data._M_bound_args);
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,__str);
  StringWriter::~StringWriter((StringWriter *)&write_data._M_bound_args);
  return __return_storage_ptr__;
}

Assistant:

string format_data(
    const struct iovec* iovs,
    size_t num_iovs,
    uint64_t start_address,
    const struct iovec* prev_iovs,
    size_t num_prev_iovs,
    uint64_t flags) {
  StringWriter w;
  // StringWriter::write is overloaded, so we have to static_cast here to
  // specify which variant should be used
  auto write_data = bind(
      static_cast<void (StringWriter::*)(const void*, size_t)>(&StringWriter::write),
      &w, placeholders::_1, placeholders::_2);
  format_data(write_data, iovs, num_iovs, start_address, prev_iovs, num_prev_iovs, flags);
  return std::move(w.str());
}